

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseStructStmt(Parser *this)

{
  Field *__args;
  TokenType TVar1;
  _Head_base<0UL,_enact::Stmt_*,_false> _Var2;
  Parser *in_RSI;
  allocator<char> local_f1;
  undefined1 local_f0 [8];
  Field local_e8;
  _Head_base<0UL,_enact::Stmt_*,_false> local_b0;
  vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> fields;
  Token fieldName;
  Token name;
  
  local_b0._M_head_impl = (Stmt *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"Expected struct name.",(allocator<char> *)&name);
  expect(in_RSI,IDENTIFIER,(string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  Token::Token(&name,&in_RSI->m_previous);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"Expected \'{\' before struct body.",
             (allocator<char> *)&fieldName);
  expect(in_RSI,LEFT_BRACE,(string *)(local_f0 + 8));
  __args = (Field *)(local_f0 + 8);
  std::__cxx11::string::~string((string *)__args);
  fields.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((TVar1 = (in_RSI->m_current).type, TVar1 != RIGHT_BRACE && (TVar1 != END_OF_FILE))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__args,"Expected field declaration in struct body.",
               (allocator<char> *)&fieldName);
    expect(in_RSI,IDENTIFIER,(string *)__args);
    std::__cxx11::string::~string((string *)__args);
    Token::Token(&fieldName,&in_RSI->m_previous);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__args,"Expected field typename.",&local_f1);
    expectTypenamePrecFunction((Parser *)local_f0,(string *)in_RSI,SUB81(__args,0));
    std::__cxx11::string::~string((string *)__args);
    Token::Token((Token *)__args,&fieldName);
    local_e8.typename_._M_t.
    super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
    super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
    super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )local_f0;
    local_f0 = (undefined1  [8])0x0;
    std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>::
    emplace_back<enact::StructStmt::Field>(&fields,__args);
    StructStmt::Field::~Field(__args);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__args,"Expected \';\' after struct field declaration.",&local_f1);
    expect(in_RSI,SEMICOLON,(string *)__args);
    std::__cxx11::string::~string((string *)__args);
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_f0)->_M_dataplus)._M_p + 8))();
    }
    std::__cxx11::string::~string((string *)&fieldName.lexeme);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f0 + 8),"Expected \'}\' after struct body.",
             (allocator<char> *)&fieldName);
  expect(in_RSI,RIGHT_BRACE,(string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  std::
  make_unique<enact::StructStmt,enact::Token&,std::vector<enact::StructStmt::Field,std::allocator<enact::StructStmt::Field>>>
            ((Token *)(local_f0 + 8),
             (vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> *)&name);
  _Var2._M_head_impl = local_b0._M_head_impl;
  (local_b0._M_head_impl)->_vptr_Stmt = (_func_int **)local_e8.name._0_8_;
  std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>::~vector(&fields)
  ;
  std::__cxx11::string::~string((string *)&name.lexeme);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         _Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseStructStmt() {
        expect(TokenType::IDENTIFIER, "Expected struct name.");
        Token name = m_previous;

        expect(TokenType::LEFT_BRACE, "Expected '{' before struct body.");

        std::vector<StructStmt::Field> fields;

        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            expect(TokenType::IDENTIFIER, "Expected field declaration in struct body.");
            // Field declaration
            Token fieldName = m_previous;
            std::unique_ptr<const Typename> fieldType = expectTypename("Expected field typename.");

            fields.push_back(StructStmt::Field{std::move(fieldName), std::move(fieldType)});

            expect(TokenType::SEMICOLON, "Expected ';' after struct field declaration.");
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after struct body.");

        return std::make_unique<StructStmt>(name, std::move(fields));
    }